

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>::
Data(Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_> *this,
    Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_> *other,
    size_t reserved)

{
  undefined8 uVar1;
  long lVar2;
  bool bVar3;
  size_t sVar4;
  int *piVar5;
  long in_RSI;
  Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint> *in_RDI;
  long in_FS_OFFSET;
  R RVar6;
  size_t otherNSpans;
  Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint> *newNode;
  Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint> *n;
  size_t index;
  Span *span;
  size_t s;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff70;
  Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint> *this_00;
  int *key;
  size_t in_stack_ffffffffffffffb0;
  ulong i;
  int *local_40;
  unsigned_long local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff70,(int)((ulong)in_RDI >> 0x20));
  (in_RDI->value).x.x = *(vec2 *)(in_RSI + 8);
  (in_RDI->value).x.A.a = 0.0;
  (in_RDI->value).x.A.b = 0.0;
  uVar1 = *(undefined8 *)(in_RSI + 0x18);
  (in_RDI->value).x.A.c = (float)(int)uVar1;
  (in_RDI->value).x.A.d = (float)(int)((ulong)uVar1 >> 0x20);
  (in_RDI->value).x.P.a = 0.0;
  (in_RDI->value).x.P.b = 0.0;
  qMax<unsigned_long>((unsigned_long *)&in_RDI->value,&local_20);
  sVar4 = GrowthPolicy::bucketsForCapacity((size_t)in_RDI);
  (in_RDI->value).x.A.a = (float)(int)sVar4;
  (in_RDI->value).x.A.b = (float)(int)(sVar4 >> 0x20);
  RVar6 = allocateSpans(in_stack_ffffffffffffffb0);
  *(Span **)&(in_RDI->value).x.P = RVar6.spans;
  piVar5 = (int *)(*(ulong *)(in_RSI + 0x10) >> 7);
  this_00 = in_RDI;
  key = piVar5;
  for (local_40 = (int *)0x0; local_40 < piVar5; local_40 = (int *)((long)local_40 + 1)) {
    lVar2 = *(long *)(in_RSI + 0x20);
    for (i = 0; i < 0x80; i = i + 1) {
      bVar3 = Span<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>::
              hasNode((Span<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>
                       *)(lVar2 + (long)local_40 * 0x90),i);
      if (bVar3) {
        Span<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>::at
                  ((Span<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>
                    *)this_00,(size_t)in_RDI);
        local_18.index = 0xaaaaaaaaaaaaaaaa;
        local_18.span = (Span *)0xaaaaaaaaaaaaaaaa;
        local_18 = findBucket<int>((Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>
                                    *)RVar6.spans,key);
        Bucket::insert((Bucket *)0x15ebb7);
        Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>::Node(this_00,in_RDI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }